

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddRecursiveImportError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int from_here)

{
  ulong uVar1;
  allocator<char> local_51;
  string error_message;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error_message,"File recursively imports itself: ",&local_51);
  for (uVar1 = (ulong)from_here;
      uVar1 < (ulong)((long)(this->tables_->pending_files_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->tables_->pending_files_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::append((char *)&error_message);
  }
  std::__cxx11::string::append((string *)&error_message);
  AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,&error_message);
  std::__cxx11::string::~string((string *)&error_message);
  return;
}

Assistant:

void DescriptorBuilder::AddRecursiveImportError(
    const FileDescriptorProto& proto, int from_here) {
  string error_message("File recursively imports itself: ");
  for (int i = from_here; i < tables_->pending_files_.size(); i++) {
    error_message.append(tables_->pending_files_[i]);
    error_message.append(" -> ");
  }
  error_message.append(proto.name());

  AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
           error_message);
}